

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_node::set_value(xml_node *this,char_t *rhs)

{
  xml_node_struct *pxVar1;
  xml_node_struct *header;
  size_t source_length;
  uint local_34;
  xml_node_type type_;
  char_t *rhs_local;
  xml_node *this_local;
  
  if (this->_root == (xml_node_struct *)0x0) {
    local_34 = 0;
  }
  else {
    local_34 = (uint)this->_root->header & 0xf;
  }
  if ((((local_34 == 3) || (local_34 == 4)) || (local_34 == 5)) ||
     ((local_34 == 6 || (local_34 == 8)))) {
    pxVar1 = this->_root;
    header = this->_root;
    source_length = impl::anon_unknown_0::strlength(rhs);
    this_local._7_1_ =
         impl::(anonymous_namespace)::strcpy_insitu<char*,unsigned_long>
                   ((char **)&pxVar1->value,&header->header,0x10,rhs,source_length);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

PUGI__FN bool xml_node::set_value(const char_t* rhs)
	{
		xml_node_type type_ = _root ? PUGI__NODETYPE(_root) : node_null;

		if (type_ != node_pcdata && type_ != node_cdata && type_ != node_comment && type_ != node_pi && type_ != node_doctype)
			return false;

		return impl::strcpy_insitu(_root->value, _root->header, impl::xml_memory_page_value_allocated_mask, rhs, impl::strlength(rhs));
	}